

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

void opj_read_bytes_LE(OPJ_BYTE *p_buffer,OPJ_UINT32 *p_value,OPJ_UINT32 p_nb_bytes)

{
  uint local_2c;
  undefined1 *puStack_28;
  OPJ_UINT32 i;
  OPJ_BYTE *l_data_ptr;
  OPJ_UINT32 p_nb_bytes_local;
  OPJ_UINT32 *p_value_local;
  OPJ_BYTE *p_buffer_local;
  
  puStack_28 = (undefined1 *)((long)p_value + (ulong)p_nb_bytes);
  if ((p_nb_bytes != 0) && (p_nb_bytes < 5)) {
    *p_value = 0;
    p_value_local = (OPJ_UINT32 *)p_buffer;
    for (local_2c = 0; puStack_28 = puStack_28 + -1, local_2c < p_nb_bytes; local_2c = local_2c + 1)
    {
      *puStack_28 = (char)*p_value_local;
      p_value_local = (OPJ_UINT32 *)((long)p_value_local + 1);
    }
    return;
  }
  __assert_fail("p_nb_bytes > 0 && p_nb_bytes <= sizeof(OPJ_UINT32)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/cio.c"
                ,0x58,"void opj_read_bytes_LE(const OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32)");
}

Assistant:

void opj_read_bytes_LE(const OPJ_BYTE * p_buffer, OPJ_UINT32 * p_value,
                       OPJ_UINT32 p_nb_bytes)
{
    OPJ_BYTE * l_data_ptr = ((OPJ_BYTE *) p_value) + p_nb_bytes - 1;
    OPJ_UINT32 i;

    assert(p_nb_bytes > 0 && p_nb_bytes <= sizeof(OPJ_UINT32));

    *p_value = 0;
    for (i = 0; i < p_nb_bytes; ++i) {
        *(l_data_ptr--) = *(p_buffer++);
    }
}